

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_consts
          (t_netstd_generator *this,ostream *out,
          vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  vector<t_const_*,_std::allocator<t_const_*>_> *pvVar1;
  bool bVar2;
  ostream *poVar3;
  reference pptVar4;
  t_type *type;
  t_const_value *value;
  vector<t_const_*,_std::allocator<t_const_*>_> local_108;
  string local_f0;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_d0;
  t_const **local_c8;
  byte local_b9;
  iterator iStack_b8;
  bool need_static_constructor;
  iterator c_iter;
  string local_90;
  string local_70;
  string local_40 [32];
  vector<t_const_*,_std::allocator<t_const_*>_> *local_20;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = consts;
  consts_local = (vector<t_const_*,_std::allocator<t_const_*>_> *)out;
  out_local = (ostream *)this;
  bVar2 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(consts);
  if (!bVar2) {
    reset_indent(this);
    pvVar1 = consts_local;
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])();
    poVar3 = std::operator<<((ostream *)pvVar1,local_40);
    netstd_type_usings_abi_cxx11_(&local_70,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string(local_40);
    start_netstd_namespace(this,(ostream *)consts_local);
    pvVar1 = consts_local;
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)pvVar1,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"public static class ");
    make_valid_csharp_identifier
              ((string *)&c_iter,this,&(this->super_t_oop_generator).super_t_generator.program_name_
              );
    poVar3 = std::operator<<(poVar3,(string *)&c_iter);
    poVar3 = std::operator<<(poVar3,"Constants");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&c_iter);
    std::__cxx11::string::~string((string *)&local_90);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)consts_local);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&stack0xffffffffffffff48);
    local_b9 = 0;
    local_c8 = (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    iStack_b8 = (iterator)local_c8;
    while( true ) {
      local_d0._M_current =
           (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffff48,&local_d0);
      pvVar1 = consts_local;
      if (!bVar2) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&stack0xffffffffffffff48);
      generate_netstd_doc(this,(ostream *)pvVar1,&(*pptVar4)->super_t_doc);
      pvVar1 = consts_local;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&stack0xffffffffffffff48);
      t_const::get_name_abi_cxx11_(&local_f0,*pptVar4);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&stack0xffffffffffffff48);
      type = t_const::get_type(*pptVar4);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&stack0xffffffffffffff48);
      value = t_const::get_value(*pptVar4);
      bVar2 = print_const_value(this,(ostream *)pvVar1,&local_f0,type,value,false,false,false);
      std::__cxx11::string::~string((string *)&local_f0);
      if (bVar2) {
        local_b9 = 1;
      }
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&stack0xffffffffffffff48);
    }
    if ((local_b9 & 1) != 0) {
      std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_108,consts);
      print_const_constructor(this,(ostream *)pvVar1,&local_108);
      std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector(&local_108);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)consts_local);
    end_netstd_namespace(this,(ostream *)consts_local);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_consts(ostream& out, vector<t_const*> consts)
{
    if (consts.empty())
    {
        return;
    }

    reset_indent();
    out << autogen_comment() << netstd_type_usings() << endl;

    start_netstd_namespace(out);

    out << indent() << "public static class " << make_valid_csharp_identifier(program_name_) << "Constants" << endl;

    scope_up(out);

    vector<t_const*>::iterator c_iter;
    bool need_static_constructor = false;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter)
    {
        generate_netstd_doc(out, *c_iter);
        if (print_const_value(out, (*c_iter)->get_name(), (*c_iter)->get_type(), (*c_iter)->get_value(), false))
        {
            need_static_constructor = true;
        }
    }

    if (need_static_constructor)
    {
        print_const_constructor(out, consts);
    }

    scope_down(out);
    end_netstd_namespace(out);
}